

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double *pdVar1;
  vector<double,_std::allocator<double>_> *__nptr;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  long lVar5;
  undefined8 uVar6;
  Cluster<double> *cluster;
  pointer pCVar7;
  double *value;
  double *pdVar8;
  istream *in;
  ulong uVar9;
  float fVar10;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  points;
  string filename;
  vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> clusters;
  ifstream infile;
  double local_298;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_290;
  undefined1 local_278 [32];
  vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> local_258;
  long local_240;
  vector<double,_std::allocator<double>_> *local_238 [2];
  vector<double,_std::allocator<double>_> local_228 [21];
  
  if (argc < 2) {
LAB_001034d1:
    std::ifstream::ifstream(local_238);
    local_298 = 1.0;
LAB_00103526:
    iVar2 = fileno(_stdin);
    iVar2 = isatty(iVar2);
    lVar5 = 0;
    if (iVar2 == 0) {
      in = (istream *)&std::cin;
      goto LAB_0010364b;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Input CSV file: ",0x10);
    local_278._8_8_ = (pointer)0x0;
    local_278[0x10] = 0;
    local_278._0_8_ = (vector<double,_std::allocator<double>_> *)(local_278 + 0x10);
    std::operator>>((istream *)&std::cin,(string *)local_278);
    in = (istream *)local_238;
    std::ifstream::open((string *)in,(_Ios_Openmode)local_278);
    if ((vector<double,_std::allocator<double>_> *)local_278._0_8_ ==
        (vector<double,_std::allocator<double>_> *)(local_278 + 0x10)) goto LAB_0010364b;
  }
  else {
    std::__cxx11::string::string((string *)local_238,argv[1],(allocator *)&local_290);
    __nptr = local_238[0];
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    *piVar3 = 0;
    fVar10 = strtof((char *)__nptr,(char **)local_278);
    if ((vector<double,_std::allocator<double>_> *)local_278._0_8_ == __nptr) {
      std::__throw_invalid_argument("stof");
LAB_001039b8:
      std::__throw_invalid_argument("stoi");
LAB_001039c4:
      uVar6 = std::__throw_out_of_range("stoi");
      std::ifstream::~ifstream(local_238);
      _Unwind_Resume(uVar6);
    }
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    else if (*piVar3 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_001034d1;
    }
    if (local_238[0] != local_228) {
      operator_delete(local_238[0]);
    }
    local_298 = (double)fVar10;
    std::ifstream::ifstream(local_238);
    if (argc == 2) goto LAB_00103526;
    in = (istream *)local_238;
    std::ifstream::open((char *)in,(_Ios_Openmode)argv[2]);
    lVar5 = 0;
    if ((uint)argc < 4) goto LAB_0010364b;
    std::__cxx11::string::string((string *)local_278,argv[3],(allocator *)&local_258);
    uVar6 = local_278._0_8_;
    iVar2 = *piVar3;
    *piVar3 = 0;
    lVar5 = strtol((char *)local_278._0_8_,(char **)&local_290,10);
    if (local_290.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)uVar6) goto LAB_001039b8;
    if (((int)lVar5 != lVar5) || (*piVar3 == 0x22)) goto LAB_001039c4;
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    if ((vector<double,_std::allocator<double>_> *)local_278._0_8_ ==
        (vector<double,_std::allocator<double>_> *)(local_278 + 0x10)) goto LAB_0010364b;
  }
  in = (istream *)local_238;
  operator_delete((void *)local_278._0_8_);
LAB_0010364b:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Kernel bandwidth: ",0x12);
  poVar4 = std::ostream::_M_insert<double>(local_298);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  load(&local_290,in,(int)lVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Num. points: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_290.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_290.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = std::chrono::_V2::system_clock::now();
    uVar9 = (ulong)((long)((local_290.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)((local_290.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
    msc::
    mean_shift<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
              (1.0 / local_298,(msc *)0x3e80000000000000,local_278,
               local_290.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_290.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,uVar9 & 0xffffffff,0x7fffffff);
    msc::
    cluster_shifted<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq>
              (0x3e80000000000000,(msc *)&local_258,local_278._0_8_,local_278._8_8_,
               uVar9 & 0xffffffff);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_278);
    local_240 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Clusters (",10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"):",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    for (pCVar7 = local_258.
                  super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pCVar7 != local_258.
                  super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pCVar7 = pCVar7 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - Num. elems.: ",0x10);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; Mode:",7);
      pdVar1 = (pCVar7->mode).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar8 = (pCVar7->mode).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
        std::ostream::_M_insert<double>(*pdVar8);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Elapsed time: ",0xe);
    poVar4 = std::ostream::_M_insert<double>((double)((local_240 - lVar5) / 1000) / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," s",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    dump(&local_290,&local_258);
    std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::~vector(&local_258);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_290);
  std::ifstream::~ifstream(local_238);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    const double bandwidth = argc > 1 ? std::stof(argv[1]) : 1;
    std::istream* in = &std::cin;
    std::ifstream infile;
    if (argc > 2)
    {
        infile.open(argv[2]);
        in = &infile;
    }
    else
    {
        #ifdef _WIN32
        if (_isatty(_fileno(stdin)))
        #else
        if (isatty(fileno(stdin)))
        #endif
        {
            std::cout << "Input CSV file: ";
            std::string filename;
            std::cin >> filename;
            infile.open(filename);
            in = &infile;
        }
    }
    const int col_offset = argc > 3 ? std::stoi(argv[3]) : 0;

    std::cerr << "Kernel bandwidth: " << bandwidth << std::endl;
    const auto points = load(*in, col_offset);
    std::cerr << "Num. points: " << points.size() << std::endl;
    if (points.empty())
        return 0;
    const auto t0 = std::chrono::high_resolution_clock::now();
    const auto clusters = msc::mean_shift_cluster<Scalar>(
        std::begin(points), std::end(points), points[0].size(),
        msc::metrics::L2Sq(),
        msc::kernels::ParabolicSq(),
        msc::estimators::Constant(bandwidth));
    const auto t1 = std::chrono::high_resolution_clock::now();
    std::cerr << "Clusters (" << clusters.size() << "):" << std::endl;
    for (const auto& cluster : clusters)
    {
        std::cerr << " - Num. elems.: " << cluster.members.size() << "; Mode:";
        for (const auto& value : cluster.mode)
            std::cerr << " " << value;
        std::cerr << std::endl;
    }
    std::cerr << "Elapsed time: " << std::chrono::duration_cast<
        std::chrono::microseconds>(t1 - t0).count() / 1e6 << " s" << std::endl;
    dump(points, clusters);
    return 0;
}